

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileExecutableTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileExecutableTargetGenerator::WriteNvidiaDeviceExecutableRule
          (cmMakefileExecutableTargetGenerator *this,bool relink,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,string *targetOutput)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  cmGeneratorTarget *pcVar1;
  cmLocalUnixMakefileGenerator3 *pcVar2;
  cmMakefile *this_01;
  string_view sVar3;
  bool bVar4;
  cmLinkLineDeviceComputer *this_02;
  cmLinkLineComputer *pcVar5;
  type linkLineComputer_00;
  string *psVar6;
  pointer pcVar7;
  char *name_00;
  container_type *pcVar8;
  string *relDir;
  type os;
  iterator __first;
  iterator __last;
  char *name;
  reference local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *real_link_command;
  iterator __end1;
  iterator __begin1;
  cmList *__range1;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  string local_5a8;
  string_view local_588;
  allocator<char> local_571;
  string local_570;
  allocator<char> local_549;
  string local_548;
  undefined1 local_528 [8];
  string val;
  string launcher;
  undefined1 local_4d8 [8];
  string targetOutPathCompilePDB;
  undefined1 local_498 [8];
  string targetFullPathCompilePDB;
  undefined1 local_448 [8];
  string target;
  string local_3f8;
  undefined1 local_3d8 [8];
  string objectDir;
  RuleVariables vars;
  string buildObjs;
  string linkLibs;
  undefined1 local_200 [8];
  string ignored_;
  string linkFlags;
  cmStateDirectory local_1a8;
  unique_ptr<cmLinkLineDeviceComputer,_std::default_delete<cmLinkLineDeviceComputer>_> local_180;
  unique_ptr<cmLinkLineDeviceComputer,_std::default_delete<cmLinkLineDeviceComputer>_>
  linkLineComputer;
  undefined1 local_170 [6];
  bool useResponseFileForLibs;
  bool useResponseFileForObjects;
  cmList real_link_commands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands1;
  string linkRule;
  undefined1 local_118 [8];
  string linkRuleVar;
  undefined1 local_f0 [7];
  bool useLinkScript;
  undefined1 local_d0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  exeCleanFiles;
  undefined1 local_98 [8];
  string langFlags;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string linkLanguage;
  string *targetOutput_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *commands_local;
  bool relink_local;
  cmMakefileExecutableTargetGenerator *this_local;
  
  linkLanguage.field_2._8_8_ = targetOutput;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"CUDA",&local_49);
  std::allocator<char>::~allocator(&local_49);
  this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&langFlags.field_2 + 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(this_00);
  cmMakefileTargetGenerator::AppendLinkDepends
            (&this->super_cmMakefileTargetGenerator,this_00,(string *)local_48);
  std::__cxx11::string::string((string *)local_98);
  pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            ((string *)
             &exeCleanFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             &this->super_cmMakefileTargetGenerator);
  cmLocalGenerator::AddLanguageFlagsForLinking
            ((cmLocalGenerator *)pcVar2,(string *)local_98,pcVar1,(string *)local_48,
             (string *)
             &exeCleanFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &exeCleanFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_d0);
  cmOutputConverter::MaybeRelativeToCurBinDir
            ((string *)local_f0,
             (cmOutputConverter *)(this->super_cmMakefileTargetGenerator).LocalGenerator,
             (string *)linkLanguage.field_2._8_8_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_d0,(value_type *)local_f0);
  std::__cxx11::string::~string((string *)local_f0);
  linkRuleVar.field_2._M_local_buf[0xf] =
       cmGlobalGenerator::GetUseLinkScript
                 ((cmGlobalGenerator *)(this->super_cmMakefileTargetGenerator).GlobalGenerator);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_118,"CMAKE_CUDA_DEVICE_LINK_EXECUTABLE",
             (allocator<char> *)(linkRule.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(linkRule.field_2._M_local_buf + 0xf));
  cmMakefileTargetGenerator::GetLinkRule
            ((string *)
             &commands1.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             &this->super_cmMakefileTargetGenerator,(string *)local_118);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&real_link_commands.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmList::cmList((cmList *)local_170,
                 (string *)
                 &commands1.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,Yes,No);
  linkLineComputer._M_t.
  super___uniq_ptr_impl<cmLinkLineDeviceComputer,_std::default_delete<cmLinkLineDeviceComputer>_>.
  _M_t.
  super__Tuple_impl<0UL,_cmLinkLineDeviceComputer_*,_std::default_delete<cmLinkLineDeviceComputer>_>
  .super__Head_base<0UL,_cmLinkLineDeviceComputer_*,_false>._M_head_impl._7_1_ =
       cmMakefileTargetGenerator::CheckUseResponseFileForObjects
                 (&this->super_cmMakefileTargetGenerator,(string *)local_48);
  linkLineComputer._M_t.
  super___uniq_ptr_impl<cmLinkLineDeviceComputer,_std::default_delete<cmLinkLineDeviceComputer>_>.
  _M_t.
  super__Tuple_impl<0UL,_cmLinkLineDeviceComputer_*,_std::default_delete<cmLinkLineDeviceComputer>_>
  .super__Head_base<0UL,_cmLinkLineDeviceComputer_*,_false>._M_head_impl._6_1_ =
       cmMakefileTargetGenerator::CheckUseResponseFileForLibraries
                 (&this->super_cmMakefileTargetGenerator,(string *)local_48);
  cmOutputConverter::SetLinkScriptShell
            ((cmOutputConverter *)(this->super_cmMakefileTargetGenerator).LocalGenerator,
             (bool)(linkRuleVar.field_2._M_local_buf[0xf] & 1));
  this_02 = (cmLinkLineDeviceComputer *)operator_new(0x40);
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmLocalGenerator::GetStateSnapshot
            ((cmStateSnapshot *)((long)&linkFlags.field_2 + 8),(cmLocalGenerator *)pcVar2);
  cmStateSnapshot::GetDirectory(&local_1a8,(cmStateSnapshot *)((long)&linkFlags.field_2 + 8));
  cmLinkLineDeviceComputer::cmLinkLineDeviceComputer(this_02,(cmOutputConverter *)pcVar2,&local_1a8)
  ;
  std::unique_ptr<cmLinkLineDeviceComputer,std::default_delete<cmLinkLineDeviceComputer>>::
  unique_ptr<std::default_delete<cmLinkLineDeviceComputer>,void>
            ((unique_ptr<cmLinkLineDeviceComputer,std::default_delete<cmLinkLineDeviceComputer>> *)
             &local_180,this_02);
  pcVar5 = &std::
            unique_ptr<cmLinkLineDeviceComputer,_std::default_delete<cmLinkLineDeviceComputer>_>::
            operator->(&local_180)->super_cmLinkLineComputer;
  cmLinkLineComputer::SetForResponse
            (pcVar5,(bool)(linkLineComputer._M_t.
                           super___uniq_ptr_impl<cmLinkLineDeviceComputer,_std::default_delete<cmLinkLineDeviceComputer>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmLinkLineDeviceComputer_*,_std::default_delete<cmLinkLineDeviceComputer>_>
                           .super__Head_base<0UL,_cmLinkLineDeviceComputer_*,_false>._M_head_impl.
                           _6_1_ & 1));
  pcVar5 = &std::
            unique_ptr<cmLinkLineDeviceComputer,_std::default_delete<cmLinkLineDeviceComputer>_>::
            operator->(&local_180)->super_cmLinkLineComputer;
  cmLinkLineComputer::SetRelink(pcVar5,relink);
  std::__cxx11::string::string((string *)(ignored_.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_200);
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  linkLineComputer_00 =
       std::unique_ptr<cmLinkLineDeviceComputer,_std::default_delete<cmLinkLineDeviceComputer>_>::
       operator*(&local_180);
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            ((string *)((long)&linkLibs.field_2 + 8),&this->super_cmMakefileTargetGenerator);
  cmLocalGenerator::GetDeviceLinkFlags
            ((cmLocalGenerator *)pcVar2,linkLineComputer_00,(string *)((long)&linkLibs.field_2 + 8),
             (string *)local_200,(string *)((long)&ignored_.field_2 + 8),(string *)local_200,
             (string *)local_200,
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  std::__cxx11::string::~string((string *)(linkLibs.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(buildObjs.field_2._M_local_buf + 8));
  pcVar5 = &std::
            unique_ptr<cmLinkLineDeviceComputer,_std::default_delete<cmLinkLineDeviceComputer>_>::
            get(&local_180)->super_cmLinkLineComputer;
  cmMakefileTargetGenerator::CreateLinkLibs
            (&this->super_cmMakefileTargetGenerator,pcVar5,
             (string *)(buildObjs.field_2._M_local_buf + 8),
             (bool)(linkLineComputer._M_t.
                    super___uniq_ptr_impl<cmLinkLineDeviceComputer,_std::default_delete<cmLinkLineDeviceComputer>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmLinkLineDeviceComputer_*,_std::default_delete<cmLinkLineDeviceComputer>_>
                    .super__Head_base<0UL,_cmLinkLineDeviceComputer_*,_false>._M_head_impl._6_1_ & 1
                   ),(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&langFlags.field_2 + 8),(string *)local_48,DeviceLink);
  std::__cxx11::string::string((string *)&vars.Launcher);
  cmMakefileTargetGenerator::CreateObjectLists
            (&this->super_cmMakefileTargetGenerator,
             (bool)(linkRuleVar.field_2._M_local_buf[0xf] & 1),false,
             (bool)(linkLineComputer._M_t.
                    super___uniq_ptr_impl<cmLinkLineDeviceComputer,_std::default_delete<cmLinkLineDeviceComputer>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmLinkLineDeviceComputer_*,_std::default_delete<cmLinkLineDeviceComputer>_>
                    .super__Head_base<0UL,_cmLinkLineDeviceComputer_*,_false>._M_head_impl._7_1_ & 1
                   ),(string *)&vars.Launcher,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&langFlags.field_2 + 8),false,(string *)local_48,DeviceLink);
  cmRulePlaceholderExpander::RuleVariables::RuleVariables
            ((RuleVariables *)((long)&objectDir.field_2 + 8));
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
            ((string *)local_3d8,
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmOutputConverter::MaybeRelativeToCurBinDir
            ((string *)((long)&target.field_2 + 8),(cmOutputConverter *)pcVar2,(string *)local_3d8);
  sVar3 = (string_view)
          std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)(target.field_2._M_local_buf + 8));
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&local_3f8,(cmOutputConverter *)pcVar2,sVar3,SHELL,false);
  std::__cxx11::string::operator=((string *)local_3d8,(string *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string((string *)(target.field_2._M_local_buf + 8));
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmOutputConverter::MaybeRelativeToCurBinDir
            ((string *)((long)&targetFullPathCompilePDB.field_2 + 8),(cmOutputConverter *)pcVar2,
             (string *)linkLanguage.field_2._8_8_);
  sVar3 = (string_view)
          std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)(targetFullPathCompilePDB.field_2._M_local_buf + 8));
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            ((string *)local_448,(cmOutputConverter *)pcVar2,sVar3,SHELL,false);
  std::__cxx11::string::~string((string *)(targetFullPathCompilePDB.field_2._M_local_buf + 8));
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            ((string *)((long)&targetOutPathCompilePDB.field_2 + 8),
             &this->super_cmMakefileTargetGenerator);
  cmCommonTargetGenerator::ComputeTargetCompilePDB
            ((string *)local_498,(cmCommonTargetGenerator *)this,
             (string *)((long)&targetOutPathCompilePDB.field_2 + 8));
  std::__cxx11::string::~string((string *)(targetOutPathCompilePDB.field_2._M_local_buf + 8));
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  sVar3 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_498)
  ;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            ((string *)local_4d8,(cmOutputConverter *)pcVar2,sVar3,SHELL,false);
  vars.TargetVersionMinor = (char *)std::__cxx11::string::c_str();
  vars.AIXExports = (char *)std::__cxx11::string::c_str();
  vars.Object = (char *)std::__cxx11::string::c_str();
  vars.Objects = (char *)std::__cxx11::string::c_str();
  vars.Target = (char *)std::__cxx11::string::c_str();
  vars.Manifests = (char *)std::__cxx11::string::c_str();
  vars.Linker = (char *)std::__cxx11::string::c_str();
  vars.TargetPDB = (char *)std::__cxx11::string::c_str();
  std::__cxx11::string::string((string *)(val.field_2._M_local_buf + 8));
  pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_548,"RULE_LAUNCH_LINK",&local_549);
  this_01 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_570,"CMAKE_BUILD_TYPE",&local_571);
  psVar6 = cmMakefile::GetSafeDefinition(this_01,&local_570);
  cmLocalGenerator::GetRuleLauncher
            ((string *)local_528,(cmLocalGenerator *)pcVar2,pcVar1,&local_548,psVar6);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator(&local_571);
  std::__cxx11::string::~string((string *)&local_548);
  std::allocator<char>::~allocator(&local_549);
  local_588 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_528);
  bVar4 = cmNonempty(local_588);
  if (bVar4) {
    rulePlaceholderExpander._M_t.
    super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
    .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl._7_1_ = 0x20;
    cmStrCat<std::__cxx11::string&,char>
              (&local_5a8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_528,
               (char *)((long)&rulePlaceholderExpander._M_t.
                               super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                               .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>.
                               _M_head_impl + 7));
    std::__cxx11::string::operator=((string *)(val.field_2._M_local_buf + 8),(string *)&local_5a8);
    std::__cxx11::string::~string((string *)&local_5a8);
  }
  (*(((this->super_cmMakefileTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator).
    super_cmLocalGenerator.super_cmOutputConverter._vptr_cmOutputConverter[6])(&__range1);
  pcVar7 = std::
           unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
           operator->((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                       *)&__range1);
  cmRulePlaceholderExpander::SetTargetImpLib(pcVar7,(string *)linkLanguage.field_2._8_8_);
  __end1 = cmList::begin_abi_cxx11_((cmList *)local_170);
  real_link_command =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       cmList::end_abi_cxx11_((cmList *)local_170);
  while( true ) {
    bVar4 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&real_link_command);
    if (!bVar4) break;
    local_5d8 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1);
    cmStrCat<std::__cxx11::string&,std::__cxx11::string&>
              ((string *)&name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&val.field_2 + 8),local_5d8);
    std::__cxx11::string::operator=((string *)local_5d8,(string *)&name);
    std::__cxx11::string::~string((string *)&name);
    pcVar7 = std::
             unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
             ::operator->((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                           *)&__range1);
    cmRulePlaceholderExpander::ExpandRuleVariables
              (pcVar7,(cmOutputConverter *)(this->super_cmMakefileTargetGenerator).LocalGenerator,
               local_5d8,(RuleVariables *)((long)&objectDir.field_2 + 8));
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  cmOutputConverter::SetLinkScriptShell
            ((cmOutputConverter *)(this->super_cmMakefileTargetGenerator).LocalGenerator,false);
  std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
  ~unique_ptr((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
               *)&__range1);
  std::__cxx11::string::~string((string *)local_528);
  std::__cxx11::string::~string((string *)(val.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_4d8);
  std::__cxx11::string::~string((string *)local_498);
  std::__cxx11::string::~string((string *)local_448);
  std::__cxx11::string::~string((string *)local_3d8);
  std::__cxx11::string::~string((string *)&vars.Launcher);
  std::__cxx11::string::~string((string *)(buildObjs.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_200);
  std::__cxx11::string::~string((string *)(ignored_.field_2._M_local_buf + 8));
  std::unique_ptr<cmLinkLineDeviceComputer,_std::default_delete<cmLinkLineDeviceComputer>_>::
  ~unique_ptr(&local_180);
  if ((linkRuleVar.field_2._M_local_buf[0xf] & 1U) == 0) {
    pcVar8 = cmList::operator_cast_to_vector_((cmList *)local_170);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&real_link_commands.Values.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,pcVar8);
  }
  else {
    name_00 = "dlink.txt";
    if (relink) {
      name_00 = "drelink.txt";
    }
    pcVar8 = cmList::operator_cast_to_vector_((cmList *)local_170);
    cmMakefileTargetGenerator::CreateLinkScript
              (&this->super_cmMakefileTargetGenerator,name_00,pcVar8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&real_link_commands.Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&langFlags.field_2 + 8));
  }
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  psVar6 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                     ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile
                     );
  relDir = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                     ((cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator);
  cmLocalUnixMakefileGenerator3::CreateCDCommand
            (pcVar2,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&real_link_commands.Values.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,psVar6,relDir);
  ::cm::
  append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
            (commands,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&real_link_commands.Values.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&real_link_commands.Values.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  os = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
       operator*(&(this->super_cmMakefileTargetGenerator).BuildFileStream);
  cmLocalUnixMakefileGenerator3::WriteMakeRule
            (pcVar2,(ostream *)os,(char *)0x0,(string *)linkLanguage.field_2._8_8_,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&langFlags.field_2 + 8),commands,false,false);
  __first = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_d0);
  __last = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_d0);
  std::
  set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&(this->super_cmMakefileTargetGenerator).CleanFiles,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )__first._M_current,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )__last._M_current);
  cmList::~cmList((cmList *)local_170);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&real_link_commands.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &commands1.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_118);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d0);
  std::__cxx11::string::~string((string *)local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&langFlags.field_2 + 8));
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void cmMakefileExecutableTargetGenerator::WriteNvidiaDeviceExecutableRule(
  bool relink, std::vector<std::string>& commands,
  const std::string& targetOutput)
{
  const std::string linkLanguage = "CUDA";

  // Build list of dependencies.
  std::vector<std::string> depends;
  this->AppendLinkDepends(depends, linkLanguage);

  // Add language feature flags.
  std::string langFlags;
  this->LocalGenerator->AddLanguageFlagsForLinking(
    langFlags, this->GeneratorTarget, linkLanguage, this->GetConfigName());

  // Construct a list of files associated with this executable that
  // may need to be cleaned.
  std::vector<std::string> exeCleanFiles;
  exeCleanFiles.push_back(
    this->LocalGenerator->MaybeRelativeToCurBinDir(targetOutput));

  // Determine whether a link script will be used.
  bool useLinkScript = this->GlobalGenerator->GetUseLinkScript();

  // Construct the main link rule.
  const std::string linkRuleVar = "CMAKE_CUDA_DEVICE_LINK_EXECUTABLE";
  const std::string linkRule = this->GetLinkRule(linkRuleVar);
  std::vector<std::string> commands1;
  cmList real_link_commands(linkRule);

  bool useResponseFileForObjects =
    this->CheckUseResponseFileForObjects(linkLanguage);
  bool const useResponseFileForLibs =
    this->CheckUseResponseFileForLibraries(linkLanguage);

  // Expand the rule variables.
  {
    // Set path conversion for link script shells.
    this->LocalGenerator->SetLinkScriptShell(useLinkScript);

    std::unique_ptr<cmLinkLineDeviceComputer> linkLineComputer(
      new cmLinkLineDeviceComputer(
        this->LocalGenerator,
        this->LocalGenerator->GetStateSnapshot().GetDirectory()));
    linkLineComputer->SetForResponse(useResponseFileForLibs);
    linkLineComputer->SetRelink(relink);

    // Create set of linking flags.
    std::string linkFlags;
    std::string ignored_;
    this->LocalGenerator->GetDeviceLinkFlags(
      *linkLineComputer, this->GetConfigName(), ignored_, linkFlags, ignored_,
      ignored_, this->GeneratorTarget);

    // Collect up flags to link in needed libraries.
    std::string linkLibs;
    this->CreateLinkLibs(
      linkLineComputer.get(), linkLibs, useResponseFileForLibs, depends,
      linkLanguage, cmMakefileTargetGenerator::ResponseFlagFor::DeviceLink);

    // Construct object file lists that may be needed to expand the
    // rule.
    std::string buildObjs;
    this->CreateObjectLists(
      useLinkScript, false, useResponseFileForObjects, buildObjs, depends,
      false, linkLanguage,
      cmMakefileTargetGenerator::ResponseFlagFor::DeviceLink);

    cmRulePlaceholderExpander::RuleVariables vars;
    std::string objectDir = this->GeneratorTarget->GetSupportDirectory();

    objectDir = this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeRelativeToCurBinDir(objectDir),
      cmOutputConverter::SHELL);

    std::string target = this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeRelativeToCurBinDir(targetOutput),
      cmOutputConverter::SHELL);

    std::string targetFullPathCompilePDB =
      this->ComputeTargetCompilePDB(this->GetConfigName());
    std::string targetOutPathCompilePDB =
      this->LocalGenerator->ConvertToOutputFormat(targetFullPathCompilePDB,
                                                  cmOutputConverter::SHELL);

    vars.Language = linkLanguage.c_str();
    vars.Objects = buildObjs.c_str();
    vars.ObjectDir = objectDir.c_str();
    vars.Target = target.c_str();
    vars.LinkLibraries = linkLibs.c_str();
    vars.LanguageCompileFlags = langFlags.c_str();
    vars.LinkFlags = linkFlags.c_str();
    vars.TargetCompilePDB = targetOutPathCompilePDB.c_str();

    std::string launcher;

    std::string val = this->LocalGenerator->GetRuleLauncher(
      this->GeneratorTarget, "RULE_LAUNCH_LINK",
      this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
    if (cmNonempty(val)) {
      launcher = cmStrCat(val, ' ');
    }

    auto rulePlaceholderExpander =
      this->LocalGenerator->CreateRulePlaceholderExpander();

    // Expand placeholders in the commands.
    rulePlaceholderExpander->SetTargetImpLib(targetOutput);
    for (auto& real_link_command : real_link_commands) {
      real_link_command = cmStrCat(launcher, real_link_command);
      rulePlaceholderExpander->ExpandRuleVariables(this->LocalGenerator,
                                                   real_link_command, vars);
    }

    // Restore path conversion to normal shells.
    this->LocalGenerator->SetLinkScriptShell(false);
  }

  // Optionally convert the build rule to use a script to avoid long
  // command lines in the make shell.
  if (useLinkScript) {
    // Use a link script.
    const char* name = (relink ? "drelink.txt" : "dlink.txt");
    this->CreateLinkScript(name, real_link_commands, commands1, depends);
  } else {
    // No link script.  Just use the link rule directly.
    commands1 = real_link_commands;
  }
  this->LocalGenerator->CreateCDCommand(
    commands1, this->Makefile->GetCurrentBinaryDirectory(),
    this->LocalGenerator->GetBinaryDirectory());
  cm::append(commands, commands1);
  commands1.clear();

  // Write the build rule.
  this->LocalGenerator->WriteMakeRule(*this->BuildFileStream, nullptr,
                                      targetOutput, depends, commands, false);

  // Clean all the possible executable names and symlinks.
  this->CleanFiles.insert(exeCleanFiles.begin(), exeCleanFiles.end());
}